

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Model::MergeFrom(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ModelDescription *this_00;
  PipelineClassifier *this_01;
  PipelineClassifier *from_00;
  OneHotEncoder *this_02;
  OneHotEncoder *from_01;
  TextClassifier *this_03;
  TextClassifier *from_02;
  GLMRegressor *this_04;
  GLMRegressor *from_03;
  GLMClassifier *this_05;
  GLMClassifier *from_04;
  Imputer *this_06;
  Imputer *from_05;
  FeatureVectorizer *this_07;
  FeatureVectorizer *from_06;
  DictVectorizer *this_08;
  DictVectorizer *from_07;
  NonMaximumSuppression *this_09;
  NonMaximumSuppression *from_08;
  Scaler *this_10;
  Scaler *from_09;
  Normalizer *this_11;
  Normalizer *from_10;
  CategoricalMapping *this_12;
  CategoricalMapping *from_11;
  ArrayFeatureExtractor *this_13;
  ArrayFeatureExtractor *from_12;
  Gazetteer *this_14;
  Gazetteer *from_13;
  BayesianProbitRegressor *this_15;
  BayesianProbitRegressor *from_14;
  NeuralNetwork *this_16;
  NeuralNetwork *from_15;
  KNearestNeighborsClassifier *this_17;
  KNearestNeighborsClassifier *from_16;
  ItemSimilarityRecommender *this_18;
  ItemSimilarityRecommender *from_17;
  SerializedModel *this_19;
  SerializedModel *from_18;
  VisionFeaturePrint *this_20;
  VisionFeaturePrint *from_19;
  TreeEnsembleRegressor *this_21;
  TreeEnsembleRegressor *from_20;
  TreeEnsembleClassifier *this_22;
  TreeEnsembleClassifier *from_21;
  SoundAnalysisPreprocessing *this_23;
  SoundAnalysisPreprocessing *from_22;
  NeuralNetworkRegressor *this_24;
  NeuralNetworkRegressor *from_23;
  Program *this_25;
  Program *from_24;
  WordTagger *this_26;
  WordTagger *from_25;
  SupportVectorRegressor *this_27;
  SupportVectorRegressor *from_26;
  NeuralNetworkClassifier *this_28;
  NeuralNetworkClassifier *from_27;
  CustomModel *this_29;
  CustomModel *from_28;
  LinkedModel *this_30;
  LinkedModel *from_29;
  SupportVectorClassifier *this_31;
  SupportVectorClassifier *from_30;
  Pipeline *this_32;
  Pipeline *from_31;
  WordEmbedding *this_33;
  WordEmbedding *from_32;
  AudioFeaturePrint *this_34;
  AudioFeaturePrint *from_33;
  Identity *this_35;
  Identity *from_34;
  PipelineRegressor *this_36;
  PipelineRegressor *from_35;
  ModelDescription *from_36;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/Model.pb.cc"
               ,0x11a5);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (Model *)&_Model_default_instance_) &&
     (from->description_ != (ModelDescription *)0x0)) {
    this_00 = mutable_description(this);
    from_36 = from->description_;
    if (from_36 == (ModelDescription *)0x0) {
      from_36 = (ModelDescription *)&_ModelDescription_default_instance_;
    }
    ModelDescription::MergeFrom(this_00,from_36);
  }
  if (from->specificationversion_ != 0) {
    this->specificationversion_ = from->specificationversion_;
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  switch(uVar1) {
  case 600:
    this_02 = mutable_onehotencoder(this);
    from_01 = onehotencoder(from);
    OneHotEncoder::MergeFrom(this_02,from_01);
    break;
  case 0x259:
    this_06 = mutable_imputer(this);
    from_05 = imputer(from);
    Imputer::MergeFrom(this_06,from_05);
    break;
  case 0x25a:
    this_07 = mutable_featurevectorizer(this);
    from_06 = featurevectorizer(from);
    FeatureVectorizer::MergeFrom(this_07,from_06);
    break;
  case 0x25b:
    this_08 = mutable_dictvectorizer(this);
    from_07 = dictvectorizer(from);
    DictVectorizer::MergeFrom(this_08,from_07);
    break;
  case 0x25c:
    this_10 = mutable_scaler(this);
    from_09 = scaler(from);
    Scaler::MergeFrom(this_10,from_09);
    break;
  case 0x25d:
  case 0x260:
    break;
  case 0x25e:
    this_12 = mutable_categoricalmapping(this);
    from_11 = categoricalmapping(from);
    CategoricalMapping::MergeFrom(this_12,from_11);
    break;
  case 0x25f:
    this_11 = mutable_normalizer(this);
    from_10 = normalizer(from);
    Normalizer::MergeFrom(this_11,from_10);
    break;
  case 0x261:
    this_13 = mutable_arrayfeatureextractor(this);
    from_12 = arrayfeatureextractor(from);
    ArrayFeatureExtractor::MergeFrom(this_13,from_12);
    break;
  case 0x262:
    this_09 = mutable_nonmaximumsuppression(this);
    from_08 = nonmaximumsuppression(from);
    NonMaximumSuppression::MergeFrom(this_09,from_08);
    break;
  default:
    switch(uVar1) {
    case 2000:
      this_03 = mutable_textclassifier(this);
      from_02 = textclassifier(from);
      CoreMLModels::TextClassifier::MergeFrom(this_03,from_02);
      break;
    case 0x7d1:
      this_26 = mutable_wordtagger(this);
      from_25 = wordtagger(from);
      CoreMLModels::WordTagger::MergeFrom(this_26,from_25);
      break;
    case 0x7d2:
      this_20 = mutable_visionfeatureprint(this);
      from_19 = visionfeatureprint(from);
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_20,from_19);
      break;
    case 0x7d3:
      this_23 = mutable_soundanalysispreprocessing(this);
      from_22 = soundanalysispreprocessing(from);
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_23,from_22);
      break;
    case 0x7d4:
      this_14 = mutable_gazetteer(this);
      from_13 = gazetteer(from);
      CoreMLModels::Gazetteer::MergeFrom(this_14,from_13);
      break;
    case 0x7d5:
      this_33 = mutable_wordembedding(this);
      from_32 = wordembedding(from);
      CoreMLModels::WordEmbedding::MergeFrom(this_33,from_32);
      break;
    case 0x7d6:
      this_34 = mutable_audiofeatureprint(this);
      from_33 = audiofeatureprint(from);
      CoreMLModels::AudioFeaturePrint::MergeFrom(this_34,from_33);
      break;
    default:
      switch(uVar1) {
      case 300:
        this_04 = mutable_glmregressor(this);
        from_03 = glmregressor(from);
        GLMRegressor::MergeFrom(this_04,from_03);
        break;
      case 0x12d:
        this_27 = mutable_supportvectorregressor(this);
        from_26 = supportvectorregressor(from);
        SupportVectorRegressor::MergeFrom(this_27,from_26);
        break;
      case 0x12e:
        this_21 = mutable_treeensembleregressor(this);
        from_20 = treeensembleregressor(from);
        TreeEnsembleRegressor::MergeFrom(this_21,from_20);
        break;
      case 0x12f:
        this_24 = mutable_neuralnetworkregressor(this);
        from_23 = neuralnetworkregressor(from);
        NeuralNetworkRegressor::MergeFrom(this_24,from_23);
        break;
      case 0x130:
        this_15 = mutable_bayesianprobitregressor(this);
        from_14 = bayesianprobitregressor(from);
        BayesianProbitRegressor::MergeFrom(this_15,from_14);
        break;
      default:
        switch(uVar1) {
        case 400:
          this_05 = mutable_glmclassifier(this);
          from_04 = glmclassifier(from);
          GLMClassifier::MergeFrom(this_05,from_04);
          break;
        case 0x191:
          this_31 = mutable_supportvectorclassifier(this);
          from_30 = supportvectorclassifier(from);
          SupportVectorClassifier::MergeFrom(this_31,from_30);
          break;
        case 0x192:
          this_22 = mutable_treeensembleclassifier(this);
          from_21 = treeensembleclassifier(from);
          TreeEnsembleClassifier::MergeFrom(this_22,from_21);
          break;
        case 0x193:
          this_28 = mutable_neuralnetworkclassifier(this);
          from_27 = neuralnetworkclassifier(from);
          NeuralNetworkClassifier::MergeFrom(this_28,from_27);
          break;
        case 0x194:
          this_17 = mutable_knearestneighborsclassifier(this);
          from_16 = knearestneighborsclassifier(from);
          KNearestNeighborsClassifier::MergeFrom(this_17,from_16);
          break;
        default:
          if (uVar1 == 3000) {
            this_19 = mutable_serializedmodel(this);
            from_18 = serializedmodel(from);
            SerializedModel::MergeFrom(this_19,from_18);
          }
          else if (uVar1 == 0xc9) {
            this_36 = mutable_pipelineregressor(this);
            from_35 = pipelineregressor(from);
            PipelineRegressor::MergeFrom(this_36,from_35);
          }
          else if (uVar1 == 0xca) {
            this_32 = mutable_pipeline(this);
            from_31 = pipeline(from);
            Pipeline::MergeFrom(this_32,from_31);
          }
          else if (uVar1 == 500) {
            this_16 = mutable_neuralnetwork(this);
            from_15 = neuralnetwork(from);
            NeuralNetwork::MergeFrom(this_16,from_15);
          }
          else if (uVar1 == 0x1f5) {
            this_18 = mutable_itemsimilarityrecommender(this);
            from_17 = itemsimilarityrecommender(from);
            ItemSimilarityRecommender::MergeFrom(this_18,from_17);
          }
          else if (uVar1 == 0x1f6) {
            this_25 = mutable_mlprogram(this);
            from_24 = mlprogram(from);
            MILSpec::Program::MergeFrom(this_25,from_24);
          }
          else if (uVar1 == 0x22b) {
            this_29 = mutable_custommodel(this);
            from_28 = custommodel(from);
            CustomModel::MergeFrom(this_29,from_28);
          }
          else if (uVar1 == 0x22c) {
            this_30 = mutable_linkedmodel(this);
            from_29 = linkedmodel(from);
            LinkedModel::MergeFrom(this_30,from_29);
          }
          else if (uVar1 == 900) {
            this_35 = mutable_identity(this);
            from_34 = identity(from);
            Identity::MergeFrom(this_35,from_34);
          }
          else if (uVar1 == 200) {
            this_01 = mutable_pipelineclassifier(this);
            from_00 = pipelineclassifier(from);
            PipelineClassifier::MergeFrom(this_01,from_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Model::MergeFrom(const Model& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Model)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_description()) {
    mutable_description()->::CoreML::Specification::ModelDescription::MergeFrom(from.description());
  }
  if (from.specificationversion() != 0) {
    set_specificationversion(from.specificationversion());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kMlProgram: {
      mutable_mlprogram()->::CoreML::Specification::MILSpec::Program::MergeFrom(from.mlprogram());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kAudioFeaturePrint: {
      mutable_audiofeatureprint()->::CoreML::Specification::CoreMLModels::AudioFeaturePrint::MergeFrom(from.audiofeatureprint());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}